

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O0

void __thiscall jsonChildren::inc(jsonChildren *this)

{
  JSONNode **ppJVar1;
  allocator local_69;
  json_string local_68;
  allocator local_31;
  json_string local_30;
  jsonChildren *local_10;
  jsonChildren *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Children is null inc",&local_31);
  JSONDebug::_JSON_ASSERT(this != (jsonChildren *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (this->mysize == this->mycapacity) {
    if (this->mycapacity == 0) {
      ppJVar1 = this->array;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_68,"Expanding a 0 capacity array, but not null",&local_69);
      JSONDebug::_JSON_ASSERT(ppJVar1 == (JSONNode **)0x0,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      ppJVar1 = json_malloc<JSONNode*>(8);
      this->array = ppJVar1;
      this->mycapacity = 8;
    }
    else {
      this->mycapacity = this->mycapacity << 1;
      ppJVar1 = json_realloc<JSONNode*>(this->array,(ulong)this->mycapacity);
      this->array = ppJVar1;
    }
  }
  return;
}

Assistant:

void jsonChildren::inc(void) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null inc"));
    if (json_unlikely(mysize == mycapacity)){  //it's full
	   if (json_unlikely(mycapacity == 0)){  //the array hasn't been created yet
		  JSON_ASSERT(!array, JSON_TEXT("Expanding a 0 capacity array, but not null"));
		  #ifdef JSON_LESS_MEMORY
			 array = json_malloc<JSONNode*>(1);
			 mycapacity = 1;
		  #else
			 array = json_malloc<JSONNode*>(8);  //8 seems average for JSON, and it's only 64 bytes
			 mycapacity = 8;
		  #endif
	   } else {
		  #ifdef JSON_LESS_MEMORY
			 mycapacity += 1;  //increment the size of the array
		  #else
			 mycapacity <<= 1;  //double the size of the array
		  #endif
		  array = json_realloc<JSONNode*>(array, mycapacity);
	   }
    }
}